

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

int __thiscall
NaPNStatistics::verify
          (NaPNStatistics *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  NaVector *pNVar5;
  ulong uVar6;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  bool local_9;
  
  uVar1 = NaVector::dim(&this->Mean);
  pNVar5 = NaPetriCnInput::data
                     ((NaPetriCnInput *)
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar2 = (*pNVar5->_vptr_NaVector[6])();
  uVar6 = 0;
  local_9 = false;
  if (uVar1 == uVar2) {
    uVar1 = NaVector::dim(&this->StdDev);
    pNVar5 = NaPetriCnInput::data
                       ((NaPetriCnInput *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar2 = (*pNVar5->_vptr_NaVector[6])();
    uVar6 = 0;
    local_9 = false;
    if (uVar1 == uVar2) {
      uVar1 = NaVector::dim(&this->RMS);
      pNVar5 = NaPetriCnInput::data
                         ((NaPetriCnInput *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      uVar2 = (*pNVar5->_vptr_NaVector[6])();
      uVar6 = 0;
      local_9 = false;
      if (uVar1 == uVar2) {
        uVar1 = NaVector::dim(&this->Min);
        pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
        uVar2 = (*pNVar5->_vptr_NaVector[6])();
        uVar6 = 0;
        local_9 = false;
        if (uVar1 == uVar2) {
          uVar2 = NaVector::dim(&this->Max);
          pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)CONCAT44(uVar1,uVar2));
          uVar3 = (*pNVar5->_vptr_NaVector[6])();
          uVar6 = 0;
          local_9 = false;
          if (uVar2 == uVar3) {
            uVar3 = NaVector::dim(&this->Sum);
            pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)CONCAT44(uVar1,uVar2));
            uVar4 = (*pNVar5->_vptr_NaVector[6])();
            uVar6 = 0;
            local_9 = false;
            if (uVar3 == uVar4) {
              uVar3 = NaVector::dim(&this->Sum2);
              pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)CONCAT44(uVar1,uVar2));
              uVar1 = (*pNVar5->_vptr_NaVector[6])();
              local_9 = uVar3 == uVar1;
              uVar6 = (ulong)CONCAT31((int3)(uVar3 >> 8),local_9);
            }
          }
        }
      }
    }
  }
  return (int)CONCAT71((int7)(uVar6 >> 8),local_9);
}

Assistant:

bool
NaPNStatistics::verify ()
{
    return Mean.dim() == signal.data().dim()
        && StdDev.dim() == signal.data().dim()
        && RMS.dim() == signal.data().dim()
        && Min.dim() == signal.data().dim()
        && Max.dim() == signal.data().dim()
        && Sum.dim() == signal.data().dim()
        && Sum2.dim() == signal.data().dim();
}